

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
ZXing::Pdf417::ReadCodeWords<ZXing::PointT<double>>
          (BitMatrixCursor<ZXing::PointT<double>_> topCur,SymbolInfo info)

{
  int iVar1;
  bool bVar2;
  CodeWord CVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  PointT<double> o;
  allocator_type local_a9;
  long local_a8;
  float local_9c;
  int local_98;
  int local_94;
  long local_90;
  ulong local_88;
  long local_80;
  undefined1 local_78 [16];
  PointT<double> local_68;
  this_t cur;
  
  dVar8 = topCur.d.x;
  dVar9 = topCur.d.y;
  if (info.lastRow < info.firstRow) {
    local_78._8_4_ = topCur.d.y._0_4_;
    local_78._0_8_ = dVar9;
    local_78._12_4_ = topCur.d.y._4_4_;
    topCur.p.x = topCur.p.x - dVar9 * (double)(info.height + -1);
    topCur.p.y = dVar8 * (double)(info.height + -1) + topCur.p.y;
    local_68.y = -dVar9;
    local_68.x = -dVar8;
    iVar5 = info.lastRow;
  }
  else {
    local_68 = topCur.d;
    local_78._8_4_ = topCur.d.y._0_4_;
    local_78._0_8_ = -dVar9;
    local_78._12_4_ = topCur.d.y._4_4_ ^ 0x80000000;
    iVar5 = info.firstRow;
    info.firstRow = info.lastRow;
  }
  local_98 = (info.colWidth * 3) / 2;
  cur.img._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (in_RDI,(long)(info.nCols * info.nRows),(value_type_conflict3 *)&cur,&local_a9);
  iVar1 = info.firstRow + 1;
  if (info.nRows <= info.firstRow + 1) {
    iVar1 = info.nRows;
  }
  local_9c = info.rowHeight;
  local_88 = 0;
  if (0 < info.nCols) {
    local_88 = (ulong)(uint)info.nCols;
  }
  uVar6 = (ulong)iVar5;
  local_80 = (long)iVar1;
  local_a8 = uVar6 * (long)info.nCols;
  local_94 = iVar5;
  local_90 = (long)info.nCols;
  do {
    if (local_80 <= (long)uVar6) {
      return in_RDI;
    }
    dVar8 = (double)(int)(((float)((int)uVar6 - local_94) + 0.5) * local_9c);
    o.y = dVar8 * local_68.x;
    o.x = (double)local_78._0_8_ * dVar8;
    BitMatrixCursor<ZXing::PointT<double>_>::movedBy(&cur,&topCur,o);
    bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isWhite(&cur);
    BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge(&cur,bVar2 | 8,local_98,false);
    iVar5 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) % 3) * 3;
    ReadCodeWord<ZXing::PointT<double>>(&cur,iVar5);
    uVar4 = local_88;
    lVar7 = local_a8;
    while (bVar2 = uVar4 != 0, uVar4 = uVar4 - 1, bVar2) {
      bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isIn(&cur);
      if (!bVar2) break;
      CVar3 = ReadCodeWord<ZXing::PointT<double>>(&cur,iVar5);
      (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar7] = CVar3.code;
      lVar7 = lVar7 + 1;
    }
    uVar6 = uVar6 + 1;
    local_a8 = local_a8 + local_90;
  } while( true );
}

Assistant:

std::vector<int> ReadCodeWords(BitMatrixCursor<POINT> topCur, SymbolInfo info)
{
	printf("rows: %d, cols: %d, rowHeight: %.1f, colWidth: %d, firstRow: %d, lastRow: %d, ecLevel: %d\n", info.nRows,
		   info.nCols, info.rowHeight, info.colWidth, info.firstRow, info.lastRow, info.ecLevel);
	auto print = [](CodeWord c [[maybe_unused]]) { printf("%4d.%d ", c.code, c.cluster); };

	auto rowSkip = topCur.right();
	if (info.firstRow > info.lastRow) {
		topCur.p += (info.height - 1) * rowSkip;
		rowSkip = -rowSkip;
		std::swap(info.firstRow, info.lastRow);
	}

	int maxColWidth = info.colWidth * 3 / 2;
	std::vector<int> codeWords(info.nRows * info.nCols, -1);
	for (int row = info.firstRow; row < std::min(info.nRows, info.lastRow + 1); ++row) {
		int cluster = (row % 3) * 3;
		auto cur = topCur.movedBy(int((row - info.firstRow + 0.5f) * info.rowHeight) * rowSkip);
		// skip start pattern
		cur.stepToEdge(8 + cur.isWhite(), maxColWidth);
		// read off left row indicator column
		auto cw [[maybe_unused]] = ReadCodeWord(cur, cluster);
		printf("%3dx%3d:%2d: ", int(cur.p.x), int(cur.p.y), Row(cw));
		print(cw);

		for (int col = 0; col < info.nCols && cur.isIn(); ++col) {
			auto cw = ReadCodeWord(cur, cluster);
			codeWords[row * info.nCols + col] = cw.code;
			print(cw);
		}

#ifdef PRINT_DEBUG
		print(ReadCodeWord(cur));
		printf("\n");
		fflush(stdout);
#endif
	}

	return codeWords;
}